

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.hpp
# Opt level: O0

void __thiscall
helics::BasicBrokerInfo::BasicBrokerInfo(BasicBrokerInfo *this,string_view brokerName)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  allocator<char> *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_19 [9];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (unaff_retaddr,in_RDX,in_RSI);
  std::allocator<char>::~allocator(local_19);
  GlobalBrokerId::GlobalBrokerId((GlobalBrokerId *)(in_RDI + 0x20));
  route_id::route_id((route_id *)(in_RDI + 0x24));
  GlobalBrokerId::GlobalBrokerId((GlobalBrokerId *)(in_RDI + 0x28));
  *(undefined1 *)(in_RDI + 0x2c) = 0;
  *(undefined1 *)(in_RDI + 0x2d) = 0;
  *(undefined1 *)(in_RDI + 0x2e) = 0;
  *(undefined1 *)(in_RDI + 0x2f) = 0;
  *(undefined1 *)(in_RDI + 0x30) = 0;
  *(undefined1 *)(in_RDI + 0x31) = 0;
  *(undefined1 *)(in_RDI + 0x32) = 0;
  *(undefined1 *)(in_RDI + 0x33) = 0;
  *(undefined1 *)(in_RDI + 0x34) = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

explicit BasicBrokerInfo(std::string_view brokerName): name(brokerName) {}